

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

TIdSentences * __thiscall
NJamSpell::TLangModel::ConvertToIds
          (TIdSentences *__return_storage_ptr__,TLangModel *this,TSentences *sentences)

{
  TWord *pTVar1;
  TWords *pTVar2;
  TWord *pTVar3;
  TWordId local_64;
  const_reference local_60;
  TWord *word;
  size_t j;
  TWordIds wordIds;
  TWords *words;
  size_t i;
  TSentences *sentences_local;
  TLangModel *this_local;
  TIdSentences *newSentences;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__);
  for (words = (TWords *)0x0;
      pTVar2 = (TWords *)
               std::
               vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               ::size(sentences), words < pTVar2;
      words = (TWords *)
              ((long)&(words->
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1)) {
    wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                  ::operator[](sentences,(size_type)words);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j);
    for (word = (TWord *)0x0; pTVar1 = word,
        pTVar3 = (TWord *)std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                                    ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                                     wordIds.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
        pTVar1 < pTVar3; word = (TWord *)((long)&word->Ptr + 1)) {
      local_60 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                           ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                            wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)word);
      local_64 = GetWordId(this,local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j,&local_64);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&j);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j);
  }
  return __return_storage_ptr__;
}

Assistant:

TIdSentences TLangModel::ConvertToIds(const TSentences& sentences) {
    TIdSentences newSentences;
    for (size_t i = 0; i < sentences.size(); ++i) {
        const TWords& words = sentences[i];
        TWordIds wordIds;
        for (size_t j = 0; j < words.size(); ++j) {
            const TWord& word = words[j];
            wordIds.push_back(GetWordId(word));
        }
        newSentences.push_back(wordIds);
    }
    return newSentences;
}